

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O2

StringRef __thiscall llvm::DataExtractor::getCStrRef(DataExtractor *this,uint64_t *offset_ptr)

{
  size_t From;
  size_t sVar1;
  char *pcVar2;
  StringRef SVar3;
  
  From = *offset_ptr;
  pcVar2 = (char *)0x0;
  sVar1 = StringRef::find(&this->Data,'\0',From);
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = 0;
  }
  else {
    *offset_ptr = sVar1 + 1;
    sVar1 = sVar1 - From;
    pcVar2 = (this->Data).Data + From;
  }
  SVar3.Length = sVar1;
  SVar3.Data = pcVar2;
  return SVar3;
}

Assistant:

StringRef DataExtractor::getCStrRef(uint64_t *offset_ptr) const {
  uint64_t Start = *offset_ptr;
  StringRef::size_type Pos = Data.find('\0', Start);
  if (Pos != StringRef::npos) {
    *offset_ptr = Pos + 1;
    return StringRef(Data.data() + Start, Pos - Start);
  }
  return StringRef();
}